

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O3

void RigidBodyDynamics::Utils::CalcZeroMomentPoint
               (Model *model,VectorNd *q,VectorNd *qdot,VectorNd *qddot,Vector3d *zmp,
               Vector3d *normal,Vector3d *point,bool update_kinematics)

{
  double *pdVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  pointer pSVar9;
  pointer pSVar10;
  pointer pSVar11;
  pointer pSVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  ulong uVar31;
  RBDLError *this;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  undefined4 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  SpatialVector hdot_tot;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  double local_1a8;
  double dStack_1a0;
  undefined1 local_198 [80];
  double dStack_148;
  double local_140;
  Vector3d *local_138;
  Vector3d *local_130;
  long local_128;
  long local_120;
  undefined1 local_118 [16];
  double local_108;
  double dStack_100;
  undefined1 local_f8 [16];
  string local_e8;
  undefined1 local_c8 [88];
  double local_70;
  SpatialVector local_68;
  
  if (zmp == (Vector3d *)0x0) {
    this = (RBDLError *)__cxa_allocate_exception(0x28);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ZMP (output) is \'NULL\'!\n","");
    Errors::RBDLError::RBDLError(this,&local_e8);
    __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  local_138 = normal;
  local_130 = zmp;
  if (update_kinematics) {
    UpdateKinematicsCustom(model,q,qdot,qddot);
  }
  uVar31 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (1 < uVar31) {
    uVar37 = 1;
    lVar34 = 0x50;
    lVar36 = 0x30;
    do {
      pSVar9 = (model->I).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar10 = (model->Ic).
                super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)
       ((long)(pSVar10->h).super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
       lVar34 + -8) =
           *(undefined8 *)
            ((long)(pSVar9->h).super_Vector3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + lVar34 + -8);
      puVar2 = (undefined8 *)
               ((long)(pSVar9->h).super_Vector3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar34);
      uVar25 = puVar2[1];
      puVar3 = (undefined8 *)
               ((long)(pSVar10->h).super_Vector3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar34);
      *puVar3 = *puVar2;
      puVar3[1] = uVar25;
      *(undefined8 *)
       ((long)(pSVar10->h).super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
       lVar34 + 0x10) =
           *(undefined8 *)
            ((long)(pSVar9->h).super_Vector3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + lVar34 + 0x10);
      puVar2 = (undefined8 *)((long)(&pSVar9->h + 1) + lVar34);
      uVar25 = puVar2[1];
      puVar3 = (undefined8 *)((long)(&pSVar9->h + 1) + lVar34 + 0x10U);
      uVar26 = *puVar3;
      uVar27 = puVar3[1];
      puVar3 = (undefined8 *)((long)(&pSVar9->h + 2) + lVar34 + 8U);
      uVar28 = *puVar3;
      uVar29 = puVar3[1];
      puVar3 = (undefined8 *)((long)(&pSVar10->h + 1) + lVar34);
      *puVar3 = *puVar2;
      puVar3[1] = uVar25;
      puVar2 = (undefined8 *)((long)(&pSVar10->h + 1) + lVar34 + 0x10U);
      *puVar2 = uVar26;
      puVar2[1] = uVar27;
      puVar2 = (undefined8 *)((long)(&pSVar10->h + 2) + lVar34 + 8U);
      *puVar2 = uVar28;
      puVar2[1] = uVar29;
      Math::SpatialRigidBodyInertia::operator*
                ((SpatialRigidBodyInertia *)
                 ((long)(((model->Ic).
                          super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                          ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar34 + -8),
                 (SpatialVector *)
                 ((long)(((model->a).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar36));
      pSVar11 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      Math::SpatialRigidBodyInertia::operator*
                ((SpatialRigidBodyInertia *)
                 ((long)(((model->Ic).
                          super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                          ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar34 + -8),
                 (SpatialVector *)
                 ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar36));
      dVar4 = *(double *)
               ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar36 + 0x10);
      dVar5 = *(double *)
               ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar36);
      dVar41 = *(double *)
                ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array + lVar36 + 8);
      dVar6 = *(double *)
               ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar36 + 0x28);
      dVar7 = *(double *)
               ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar36 + 0x20);
      dVar8 = *(double *)
               ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar36 + 0x18);
      pSVar11 = (model->hdotc).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (double *)
               ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar36);
      *pdVar1 = dVar7 * (double)local_c8._40_8_ +
                (double)local_c8._32_8_ * -dVar6 +
                -dVar4 * (double)local_c8._8_8_ + dVar41 * (double)local_c8._16_8_ +
                (double)local_198._0_8_;
      pdVar1[1] = -dVar8 * (double)local_c8._40_8_ +
                  (double)local_c8._24_8_ * dVar6 +
                  dVar4 * (double)local_c8._0_8_ + -dVar5 * (double)local_c8._16_8_ +
                  (double)local_198._8_8_;
      pdVar1 = (double *)
               ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar36 + 0x10);
      *pdVar1 = (double)local_c8._32_8_ * dVar8 +
                (((double)local_c8._8_8_ * dVar5 - dVar41 * (double)local_c8._0_8_) -
                dVar7 * (double)local_c8._24_8_) + (double)local_198._16_8_;
      pdVar1[1] = (double)local_c8._32_8_ * -dVar4 + (double)local_c8._40_8_ * dVar41 +
                  (double)local_198._24_8_;
      pdVar1 = (double *)
               ((long)(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar36 + 0x20);
      *pdVar1 = (double)local_c8._24_8_ * dVar4 + -dVar5 * (double)local_c8._40_8_ +
                (double)local_198._32_8_;
      pdVar1[1] = (double)local_c8._24_8_ * -dVar41 + dVar5 * (double)local_c8._32_8_ +
                  (double)local_198._40_8_;
      uVar37 = uVar37 + 1;
      uVar31 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      lVar34 = lVar34 + 0x50;
      lVar36 = lVar36 + 0x30;
    } while (uVar37 < uVar31);
  }
  local_f8 = ZEXT816(0);
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_118 = ZEXT816(0);
  lVar34 = uVar31 - 1;
  if (lVar34 == 0) {
    local_1b8._0_8_ = 0.0;
    local_1a8 = 0.0;
    dStack_1a0 = 0.0;
    local_1c8._0_8_ = 0.0;
  }
  else {
    local_1a8 = 0.0;
    dStack_1a0 = 0.0;
    local_1c8 = ZEXT816(0);
    local_1b8 = ZEXT816(0);
    lVar35 = uVar31 * 0x60;
    lVar36 = uVar31 * 0x50;
    lVar33 = uVar31 * 0x30;
    do {
      lVar32 = lVar36 + -0x50;
      uVar31 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar34];
      if (uVar31 == 0) {
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)local_198,
                   (SpatialTransform *)
                   ((long)(model->X_lambda).
                          super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + lVar35),
                   (SpatialRigidBodyInertia *)
                   ((long)(model->Ic).
                          super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].h.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + lVar36 + -8));
        uVar38 = local_1c8._12_4_;
        local_1c8._8_4_ = local_1c8._8_4_;
        local_1c8._0_8_ = local_1c8._0_8_ + (double)local_198._0_8_;
        local_1c8._12_4_ = uVar38;
        local_1a8 = local_1a8 + (double)local_198._8_8_;
        dStack_1a0 = dStack_1a0 + (double)local_198._16_8_;
        uVar38 = local_1b8._12_4_;
        local_1b8._8_4_ = local_1b8._8_4_;
        local_1b8._0_8_ = local_1b8._0_8_ + (double)local_198._24_8_;
        local_1b8._12_4_ = uVar38;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)(model->X_lambda).
                          super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + lVar35),
                   (SpatialVector *)
                   ((long)(model->hc).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].
                          super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + lVar33));
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)(model->X_lambda).
                          super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + lVar35),
                   (SpatialVector *)
                   ((long)(model->hdotc).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].
                          super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + lVar33));
        dVar4 = (double)local_118._8_8_ + (double)local_198._8_8_;
        local_118._8_4_ = SUB84(dVar4,0);
        local_118._0_8_ = (double)local_118._0_8_ + (double)local_198._0_8_;
        local_118._12_4_ = (int)((ulong)dVar4 >> 0x20);
        local_108 = local_108 + (double)local_198._16_8_;
        dStack_100 = dStack_100 + (double)local_198._24_8_;
        dVar4 = (double)local_f8._8_8_ + (double)local_198._40_8_;
        local_f8._8_4_ = SUB84(dVar4,0);
        local_f8._0_8_ = (double)local_f8._0_8_ + (double)local_198._32_8_;
        local_f8._12_4_ = (int)((ulong)dVar4 >> 0x20);
      }
      else {
        pSVar9 = (model->Ic).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_128 = lVar32;
        local_120 = lVar34;
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)local_198,
                   (SpatialTransform *)
                   ((long)(model->X_lambda).
                          super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + lVar35),
                   (SpatialRigidBodyInertia *)
                   ((long)pSVar9[-1].h.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + lVar36 + -8));
        lVar32 = local_128;
        dVar7 = *(double *)&pSVar9[uVar31].h.super_Vector3d;
        dVar6 = (double)local_198._16_8_ +
                pSVar9[uVar31].h.super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [1];
        dVar4 = pSVar9[uVar31].Izz;
        pSVar10 = (model->Ic).
                  super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = pSVar9[uVar31].h.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 + 2;
        dVar8 = *pdVar1;
        dVar22 = pdVar1[1];
        pSVar10[uVar31].m = pSVar9[uVar31].m + (double)local_198._0_8_;
        dVar23 = pSVar9[uVar31].Iyx;
        dVar24 = (&pSVar9[uVar31].Iyx)[1];
        dVar5 = (double)local_198._56_8_ + pSVar9[uVar31].Izx;
        dVar41 = (double)local_198._64_8_ + (&pSVar9[uVar31].Izx)[1];
        auVar20._8_4_ = SUB84(dVar6,0);
        auVar20._0_8_ = (double)local_198._8_8_ + dVar7;
        auVar20._12_4_ = (int)((ulong)dVar6 >> 0x20);
        *(undefined1 (*) [16])&pSVar10[uVar31].h.super_Vector3d = auVar20;
        pdVar1 = pSVar10[uVar31].h.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 + 2;
        *pdVar1 = dVar8 + (double)local_198._24_8_;
        pdVar1[1] = dVar22 + (double)local_198._32_8_;
        pSVar10[uVar31].Iyx = (double)local_198._40_8_ + dVar23;
        (&pSVar10[uVar31].Iyx)[1] = (double)local_198._48_8_ + dVar24;
        auVar40._8_4_ = SUB84(dVar41,0);
        auVar40._0_8_ = dVar5;
        auVar40._12_4_ = (int)((ulong)dVar41 >> 0x20);
        pSVar10[uVar31].Izx = dVar5;
        pSVar10[uVar31].Izy = (Scalar)auVar40._8_8_;
        pSVar10[uVar31].Izz = dVar4 + (double)local_198._72_8_;
        pSVar11 = (model->hc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)(model->X_lambda).
                          super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + lVar35),
                   (SpatialVector *)
                   ((long)pSVar11[-1].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + lVar33));
        pSVar12 = (model->hc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar4 = pSVar11[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [1] + (double)local_198._8_8_;
        auVar13._8_4_ = SUB84(dVar4,0);
        auVar13._0_8_ =
             *(double *)
              &pSVar11[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
             (double)local_198._0_8_;
        auVar13._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar12[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar13;
        pdVar1 = pSVar11[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 + 2;
        dVar4 = pdVar1[1] + (double)local_198._24_8_;
        auVar14._8_4_ = SUB84(dVar4,0);
        auVar14._0_8_ = *pdVar1 + (double)local_198._16_8_;
        auVar14._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])
         (pSVar12[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 2) =
             auVar14;
        pdVar1 = pSVar11[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 + 4;
        dVar4 = pdVar1[1] + (double)local_198._40_8_;
        auVar15._8_4_ = SUB84(dVar4,0);
        auVar15._0_8_ = *pdVar1 + (double)local_198._32_8_;
        auVar15._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])
         (pSVar12[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 4) =
             auVar15;
        pSVar11 = (model->hdotc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)(model->X_lambda).
                          super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + lVar35),
                   (SpatialVector *)
                   ((long)pSVar11[-1].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + lVar33));
        pSVar12 = (model->hdotc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar4 = pSVar11[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [1] + (double)local_198._8_8_;
        auVar16._8_4_ = SUB84(dVar4,0);
        auVar16._0_8_ =
             *(double *)
              &pSVar11[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
             (double)local_198._0_8_;
        auVar16._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar12[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar16;
        pdVar1 = pSVar11[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 + 2;
        dVar4 = pdVar1[1] + (double)local_198._24_8_;
        auVar17._8_4_ = SUB84(dVar4,0);
        auVar17._0_8_ = *pdVar1 + (double)local_198._16_8_;
        auVar17._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])
         (pSVar12[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 2) =
             auVar17;
        pdVar1 = pSVar11[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 + 4;
        dVar4 = pdVar1[1] + (double)local_198._40_8_;
        auVar18._8_4_ = SUB84(dVar4,0);
        auVar18._0_8_ = *pdVar1 + (double)local_198._32_8_;
        auVar18._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])
         (pSVar12[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 4) =
             auVar18;
        lVar34 = local_120;
      }
      lVar34 = lVar34 + -1;
      lVar35 = lVar35 + -0x60;
      lVar36 = lVar32;
      lVar33 = lVar33 + -0x30;
    } while (lVar34 != 0);
  }
  auVar30._8_8_ = dStack_1a0;
  auVar30._0_8_ = local_1a8;
  auVar19._8_4_ = (int)local_1c8._0_8_;
  auVar19._0_8_ = local_1c8._0_8_;
  auVar19._12_4_ = SUB84(local_1c8._0_8_,4);
  register0x00001240 = divpd(auVar30,auVar19);
  local_140 = (double)local_1b8._0_8_ / (double)local_1c8._0_8_;
  local_198._8_8_ = 0.0;
  local_198._16_8_ = 0.0;
  local_198._24_8_ = 0.0;
  local_198._40_8_ = 0.0;
  local_198._48_8_ = 0.0;
  local_198._56_8_ = 0.0;
  local_198._0_8_ = 1.0;
  local_198._32_8_ = 1.0;
  local_198._64_8_ = 1.0;
  Math::SpatialTransform::applyAdjoint
            ((SpatialVector *)local_c8,(SpatialTransform *)local_198,(SpatialVector *)local_118);
  local_118._0_8_ = (double)local_c8._0_8_ - (double)local_1c8._0_8_ * 0.0;
  local_118._8_8_ = (double)local_c8._8_8_ - (double)local_1c8._0_8_ * 0.0;
  local_108 = (double)local_c8._16_8_ - (double)local_1c8._0_8_ * 0.0;
  dStack_100 = (double)local_c8._24_8_ -
               (model->gravity).super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] * (double)local_1c8._0_8_;
  local_f8._0_8_ =
       (double)local_c8._32_8_ -
       (double)local_1c8._0_8_ *
       (model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  local_f8._8_8_ =
       (double)local_c8._40_8_ -
       (double)local_1c8._0_8_ *
       (model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  local_c8._0_8_ = local_198._0_8_;
  local_c8._8_8_ = local_198._24_8_;
  local_c8._16_8_ = local_198._48_8_;
  local_c8._24_8_ = local_198._8_8_;
  local_c8._32_8_ = local_198._32_8_;
  local_c8._40_8_ = local_198._56_8_;
  local_c8._48_8_ = local_198._16_8_;
  local_c8._56_8_ = local_198._40_8_;
  dVar4 = ((double)local_198._72_8_ * -(double)local_198._8_8_ -
          dStack_148 * (double)local_198._32_8_) - (double)local_198._56_8_ * local_140;
  local_70 = (-(double)local_198._64_8_ * local_140 - (double)local_198._40_8_ * dStack_148) -
             (double)local_198._72_8_ * (double)local_198._16_8_;
  local_c8._64_8_ = local_198._64_8_;
  local_c8._80_4_ = SUB84(dVar4,0);
  local_c8._72_8_ =
       ((double)local_198._72_8_ * -(double)local_198._0_8_ - dStack_148 * (double)local_198._24_8_)
       - (double)local_198._48_8_ * local_140;
  local_c8._84_4_ = (int)((ulong)dVar4 >> 0x20);
  local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (double)local_1c8._0_8_;
  local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       (double)local_c8;
  Math::SpatialTransform::applyAdjoint
            (&local_68,(SpatialTransform *)local_c8,(SpatialVector *)local_118);
  dVar4 = (local_138->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0];
  dVar5 = (local_138->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  dVar41 = (local_138->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
  auVar39._0_8_ =
       local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
       dVar5 - local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] * dVar41;
  auVar39._8_8_ =
       local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
       dVar41 - local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [2] * dVar4;
  dVar41 = dVar41 * local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5] +
           (local_138->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1] *
           local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] +
           (local_138->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0] *
           local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  auVar21._8_8_ = dVar41;
  auVar21._0_8_ = dVar41;
  auVar40 = divpd(auVar39,auVar21);
  *(undefined1 (*) [16])
   (local_130->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
   m_storage.m_data.array = auVar40;
  (local_130->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
  .m_data.array[2] =
       (local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] *
        dVar4 - local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [0] * dVar5) / dVar41;
  return;
}

Assistant:

RBDL_DLLAPI void CalcZeroMomentPoint (
  Model &model,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot,
  const Math::VectorNd &qddot,
  Vector3d* zmp,
  const Math::Vector3d &normal,
  const Math::Vector3d &point,
  bool update_kinematics
)
{
  if (zmp == NULL) {
    throw Errors::RBDLError("ZMP (output) is 'NULL'!\n");
  }

  // update kinematics if required
  // NOTE UpdateKinematics computes model.a[i] and model.v[i] required for
  //      change of momentum
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &q, &qdot, &qddot);
  }

  // compute change of momentum of each single body (same as in RNEA/InverseDynamics)
  for (size_t i = 1; i < model.mBodies.size(); i++) {
    model.Ic[i] = model.I[i];
    model.hdotc[i] = model.Ic[i] * model.a[i] + crossf(model.v[i],
                     model.Ic[i] * model.v[i]);
  }

  SpatialRigidBodyInertia I_tot (0., Vector3d (0., 0., 0.), Matrix3d::Zero());
  SpatialVector h_tot (SpatialVector::Zero());
  SpatialVector hdot_tot (SpatialVector::Zero());

  // compute total change of momentum and CoM wrt to root body (idx = 0)
  // by recursively summing up local change of momentum
  for (size_t i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int lambda = model.lambda[i];

    if (lambda != 0) {
      model.Ic[lambda] = model.Ic[lambda] + model.X_lambda[i].applyTranspose (
                           model.Ic[i]);
      model.hc[lambda] = model.hc[lambda] + model.X_lambda[i].applyTranspose (
                           model.hc[i]);
      model.hdotc[lambda] = model.hdotc[lambda] + model.X_lambda[i].applyTranspose (
                              model.hdotc[i]);
    } else {
      I_tot = I_tot + model.X_lambda[i].applyTranspose (model.Ic[i]);
      h_tot = h_tot + model.X_lambda[i].applyTranspose (model.hc[i]);
      hdot_tot = hdot_tot + model.X_lambda[i].applyTranspose (model.hdotc[i]);
    }
  }

  // compute CoM from mass and total inertia
  const Scalar mass = I_tot.m;
  const Vector3d com = I_tot.h / mass;

  // project angular momentum onto CoM
  SpatialTransform Xcom = Xtrans (com);
  hdot_tot = Xcom.applyAdjoint (hdot_tot);

  // compute net external force at CoM by removing effects due to gravity
  hdot_tot = hdot_tot - mass * SpatialVector (0., 0., 0., model.gravity[0],
             model.gravity[1], model.gravity[2]);

  // express total change of momentum in world coordinates
  hdot_tot = Xcom.inverse().applyAdjoint (hdot_tot);

  // project purified change of momentum onto surface
  // z = n x n_0
  //     -------
  //     n * f
  Vector3d n_0 = hdot_tot.block<3,1>(0,0);
  Vector3d f = hdot_tot.block<3,1>(3,0);
  *zmp = normal.cross(n_0) / normal.dot(f);

  // double distance = (hdot_tot - point).dot(normal);
  // zmp = hdot_tot - distance * normal;

  return;
}